

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observers.cpp
# Opt level: O0

int main(void)

{
  int local_10c [2];
  bool local_102;
  bool local_101 [17];
  int local_f0;
  bool local_ea;
  bool local_e9 [22];
  bool local_d3;
  bool local_d2;
  bool local_d1 [33];
  undefined1 local_b0 [8];
  ObserverC c;
  ObserverB b;
  ObserverA a;
  O o;
  
  O::O((O *)&a.a);
  ObserverA::ObserverA((ObserverA *)&b.b);
  ObserverB::ObserverB((ObserverB *)&c.b_arg);
  ObserverC::ObserverC((ObserverC *)local_b0);
  obs::observable<Observer>::add_observer((observable<Observer> *)&a.a,(Observer *)&b.b);
  obs::observable<Observer>::add_observer((observable<Observer> *)&a.a,(Observer *)&c.b_arg);
  obs::observable<Observer>::add_observer((observable<Observer> *)&a.a,(Observer *)local_b0);
  local_d1[9] = false;
  local_d1[10] = false;
  local_d1[0xb] = false;
  local_d1[0xc] = false;
  local_d1[0xd] = false;
  local_d1[0xe] = false;
  local_d1[0xf] = false;
  local_d1[0x10] = false;
  local_d1[1] = true;
  local_d1[2] = false;
  local_d1[3] = false;
  local_d1[4] = false;
  local_d1[5] = false;
  local_d1[6] = false;
  local_d1[7] = false;
  local_d1[8] = false;
  obs::observable<Observer>::notify_observers((observable<Observer> *)&a.a,0x11);
  local_d1[0] = true;
  expect_eq<bool,bool>
            (local_d1,(bool *)&a,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x3f);
  local_d2 = false;
  expect_eq<bool,bool>
            (&local_d2,(bool *)&b,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x40);
  local_d3 = false;
  expect_eq<bool,bool>
            (&local_d3,(bool *)&c,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x41);
  local_e9[9] = false;
  local_e9[10] = false;
  local_e9[0xb] = false;
  local_e9[0xc] = false;
  local_e9[0xd] = false;
  local_e9[0xe] = false;
  local_e9[0xf] = false;
  local_e9[0x10] = false;
  local_e9[1] = true;
  local_e9[2] = false;
  local_e9[3] = false;
  local_e9[4] = false;
  local_e9[5] = false;
  local_e9[6] = false;
  local_e9[7] = false;
  local_e9[8] = false;
  obs::observable<Observer>::notify_observers<int>((observable<Observer> *)&a.a,0x19,0);
  local_e9[0] = true;
  expect_eq<bool,bool>
            (local_e9,(bool *)&b,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x44);
  local_ea = false;
  expect_eq<bool,bool>
            (&local_ea,(bool *)&c,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x45);
  local_f0 = 1;
  expect_eq<int,int>(&local_f0,(int *)((long)&b.super_Observer._vptr_Observer + 4),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
                     ,0x46);
  local_101[9] = false;
  local_101[10] = false;
  local_101[0xb] = false;
  local_101[0xc] = false;
  local_101[0xd] = false;
  local_101[0xe] = false;
  local_101[0xf] = false;
  local_101[0x10] = false;
  local_101[1] = true;
  local_101[2] = false;
  local_101[3] = false;
  local_101[4] = false;
  local_101[5] = false;
  local_101[6] = false;
  local_101[7] = false;
  local_101[8] = false;
  obs::observable<Observer>::notify_observers<int,int>((observable<Observer> *)&a.a,0x21,0,1);
  local_101[0] = true;
  expect_eq<bool,bool>
            (local_101,(bool *)&b,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x49);
  local_102 = true;
  expect_eq<bool,bool>
            (&local_102,(bool *)&c,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
             ,0x4a);
  local_10c[1] = 1;
  expect_eq<int,int>(local_10c + 1,(int *)((long)&c.super_Observer._vptr_Observer + 4),
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
                     ,0x4b);
  local_10c[0] = 2;
  expect_eq<int,int>(local_10c,(int *)&c.c,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/observers.cpp"
                     ,0x4c);
  ObserverC::~ObserverC((ObserverC *)local_b0);
  ObserverB::~ObserverB((ObserverB *)&c.b_arg);
  ObserverA::~ObserverA((ObserverA *)&b.b);
  O::~O((O *)&a.a);
  return 0;
}

Assistant:

int main() {
  O o;
  ObserverA a;
  ObserverB b;
  ObserverC c;
  o.add_observer(&a);
  o.add_observer(&b);
  o.add_observer(&c);

  o.notify_observers(&Observer::on_event_a);
  EXPECT_TRUE(a.a);
  EXPECT_FALSE(b.b);
  EXPECT_FALSE(c.c);

  o.notify_observers(&Observer::on_event_b, 1);
  EXPECT_TRUE(b.b);
  EXPECT_FALSE(c.c);
  EXPECT_EQ(1, b.a_arg);

  o.notify_observers(&Observer::on_event_c, 1, 2);
  EXPECT_TRUE(b.b);
  EXPECT_TRUE(c.c);
  EXPECT_EQ(1, c.a_arg);
  EXPECT_EQ(2, c.b_arg);
}